

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O3

void __thiscall
Js::DebugContext::WalkAndAddUtf8SourceInfo
          (DebugContext *this,Utf8SourceInfo *sourceInfo,
          List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
          *utf8SourceInfoList)

{
  ScriptContext *this_00;
  WriteBarrierPtr<Js::Utf8SourceInfo> *pWVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  Utf8SourceInfo *sourceInfo_00;
  ulong uVar6;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar7;
  undefined4 *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  Utf8SourceInfo *local_38;
  Utf8SourceInfo *sourceInfo_local;
  
  local_38 = sourceInfo;
  sourceInfo_00 = Utf8SourceInfo::GetCallerUtf8SourceInfo(sourceInfo);
  if (sourceInfo_00 != (Utf8SourceInfo *)0x0) {
    this_00 = (sourceInfo_00->m_scriptContext).ptr;
    Output::Trace(DebuggerPhase,
                  L"DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"
                  ,this->scriptContext,sourceInfo,sourceInfo_00,(sourceInfo->m_scriptContext).ptr,
                  this_00);
    if ((sourceInfo->m_scriptContext).ptr == this_00) {
      WalkAndAddUtf8SourceInfo(this,sourceInfo_00,utf8SourceInfoList);
    }
    else {
      bVar5 = ScriptContext::IsScriptContextInNonDebugMode(this_00);
      if (bVar5) {
        ScriptContext::AddCalleeSourceInfoToList(this_00,sourceInfo);
      }
    }
  }
  uVar6 = (ulong)(utf8SourceInfoList->
                 super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>
                 ).count;
  if (0 < (long)uVar6) {
    pWVar1 = (utf8SourceInfoList->
             super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
             buffer.ptr;
    if (pWVar1->ptr == sourceInfo) {
      return;
    }
    uVar4 = 1;
    do {
      uVar10 = uVar4;
      if (uVar6 == uVar10) break;
      uVar4 = uVar10 + 1;
    } while (pWVar1[uVar10].ptr != sourceInfo);
    if (uVar10 < uVar6) {
      return;
    }
  }
  Output::Trace(DebuggerPhase,
                L"DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"
                ,this->scriptContext,sourceInfo,(sourceInfo->m_scriptContext).ptr);
  pLVar7 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->scriptContext->sourceList);
  lVar9 = (long)(pLVar7->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count;
  if (0 < lVar9) {
    bVar5 = false;
    lVar11 = 0;
    do {
      pRVar2 = (pLVar7->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar11].ptr;
      if (((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) {
        bVar5 = (bool)(bVar5 | (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef
                               == sourceInfo);
      }
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
    if (bVar5) goto LAB_008a7452;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                              ,0x1b0,"(found)","Parented eval feature have extra source");
  if (!bVar5) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar8 = 0;
LAB_008a7452:
  JsUtil::
  List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
  ::Add(utf8SourceInfoList,&local_38);
  return;
}

Assistant:

void DebugContext::WalkAndAddUtf8SourceInfo(Js::Utf8SourceInfo* sourceInfo, JsUtil::List<Js::Utf8SourceInfo *, Recycler, false, Js::CopyRemovePolicy, RecyclerPointerComparer> *utf8SourceInfoList)
    {
        Js::Utf8SourceInfo* callerUtf8SourceInfo = sourceInfo->GetCallerUtf8SourceInfo();
        if (callerUtf8SourceInfo)
        {
            Js::ScriptContext* callerScriptContext = callerUtf8SourceInfo->GetScriptContext();
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo scriptContext 0x%p, sourceInfo 0x%p, callerUtf8SourceInfo 0x%p, sourceInfo scriptContext 0x%p, callerUtf8SourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, callerUtf8SourceInfo, sourceInfo->GetScriptContext(), callerScriptContext);

            if (sourceInfo->GetScriptContext() == callerScriptContext)
            {
                WalkAndAddUtf8SourceInfo(callerUtf8SourceInfo, utf8SourceInfoList);
            }
            else if (callerScriptContext->IsScriptContextInNonDebugMode())
            {
                // The caller scriptContext is not in run down/debug mode so let's save the relationship so that we can re-parent callees afterwards.
                callerScriptContext->AddCalleeSourceInfoToList(sourceInfo);
            }
        }
        if (!utf8SourceInfoList->Contains(sourceInfo))
        {
            OUTPUT_TRACE(Js::DebuggerPhase, _u("DebugContext::WalkAndAddUtf8SourceInfo Adding to utf8SourceInfoList scriptContext 0x%p, sourceInfo 0x%p, sourceInfo scriptContext 0x%p\n"),
                this->scriptContext, sourceInfo, sourceInfo->GetScriptContext());
#if DBG
            bool found = false;
            this->MapUTF8SourceInfoUntil([&](Js::Utf8SourceInfo * sourceInfoTemp) -> bool
            {
                if (sourceInfoTemp == sourceInfo)
                {
                    found = true;
                }
                return found;
            });
            AssertMsg(found, "Parented eval feature have extra source");
#endif
            utf8SourceInfoList->Add(sourceInfo);
        }
    }